

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

reference<mpt::content<mpt::item<mpt::layout::graph::axis>_>_> * __thiscall
mpt::reference<mpt::content<mpt::item<mpt::layout::graph::axis>_>_>::operator=
          (reference<mpt::content<mpt::item<mpt::layout::graph::axis>_>_> *this,
          reference<mpt::content<mpt::item<mpt::layout::graph::axis>_>_> *ref)

{
  int iVar1;
  undefined4 extraout_var;
  content<mpt::item<mpt::layout::graph::axis>_> *local_28;
  content<mpt::item<mpt::layout::graph::axis>_> *r;
  reference<mpt::content<mpt::item<mpt::layout::graph::axis>_>_> *ref_local;
  reference<mpt::content<mpt::item<mpt::layout::graph::axis>_>_> *this_local;
  
  local_28 = ref->_ref;
  if (local_28 != this->_ref) {
    if ((local_28 != (content<mpt::item<mpt::layout::graph::axis>_> *)0x0) &&
       (iVar1 = (*(local_28->super_buffer)._vptr_buffer[2])(), CONCAT44(extraout_var,iVar1) == 0)) {
      local_28 = (content<mpt::item<mpt::layout::graph::axis>_> *)0x0;
    }
    if (this->_ref != (content<mpt::item<mpt::layout::graph::axis>_> *)0x0) {
      (*(this->_ref->super_buffer)._vptr_buffer[1])();
    }
    this->_ref = local_28;
  }
  return this;
}

Assistant:

inline reference & operator= (reference const &ref)
	{
		T *r = ref._ref;
		if (r == _ref) {
			return *this;
		}
		if (r && !r->addref()) {
			r = 0;
		}
		if (_ref) _ref->unref();
		_ref = r;
		return *this;
	}